

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualAllocWrapper.cpp
# Opt level: O0

LPVOID __thiscall
Memory::VirtualAllocWrapper::AllocPages
          (VirtualAllocWrapper *this,LPVOID lpAddress,size_t pageCount,DWORD allocationType,
          DWORD protectFlags,bool isCustomHeapAllocation)

{
  LPVOID address;
  size_t dwSize;
  bool isCustomHeapAllocation_local;
  DWORD protectFlags_local;
  DWORD allocationType_local;
  size_t pageCount_local;
  LPVOID lpAddress_local;
  VirtualAllocWrapper *this_local;
  
  if (pageCount < 0x10000000000000) {
    this_local = (VirtualAllocWrapper *)
                 VirtualAlloc(lpAddress,pageCount << 0xc,allocationType,protectFlags);
    if (this_local == (VirtualAllocWrapper *)0x0) {
      MemoryOperationLastError::RecordLastError();
      this_local = (VirtualAllocWrapper *)0x0;
    }
  }
  else {
    this_local = (VirtualAllocWrapper *)0x0;
  }
  return this_local;
}

Assistant:

LPVOID VirtualAllocWrapper::AllocPages(LPVOID lpAddress, size_t pageCount, DWORD allocationType, DWORD protectFlags, bool isCustomHeapAllocation)
{
    if (pageCount > AutoSystemInfo::MaxPageCount)
    {
        return nullptr;
    }
    size_t dwSize = pageCount * AutoSystemInfo::PageSize;

    LPVOID address = nullptr;

#if defined(ENABLE_JIT_CLAMP)
    bool makeExecutable;

    if ((isCustomHeapAllocation) ||
        (protectFlags & (PAGE_EXECUTE | PAGE_EXECUTE_READ | PAGE_EXECUTE_READWRITE)))
    {
        makeExecutable = true;
    }
    else
    {
        makeExecutable = false;
    }

    AutoEnableDynamicCodeGen enableCodeGen(makeExecutable);
#endif

#if defined(_CONTROL_FLOW_GUARD)
    DWORD oldProtectFlags = 0;
    if (GlobalSecurityPolicy::IsCFGEnabled() && isCustomHeapAllocation)
    {
        //We do the allocation in two steps - CFG Bitmap in kernel will be created only on allocation with EXECUTE flag.
        //We again call VirtualProtect to set to the requested protectFlags.
        DWORD allocProtectFlags = 0;
        if (GlobalSecurityPolicy::IsCFGEnabled())
        {
            allocProtectFlags = PAGE_EXECUTE_RW_TARGETS_INVALID;
        }
        else
        {
            allocProtectFlags = PAGE_EXECUTE_READWRITE;
        }

        address = VirtualAlloc(lpAddress, dwSize, allocationType, allocProtectFlags);
        if (address == nullptr)
        {
            MemoryOperationLastError::RecordLastError();
            return nullptr;
        }
        else if ((allocationType & MEM_COMMIT) == MEM_COMMIT) // The access protection value can be set only on committed pages.
        {
            BOOL result = VirtualProtect(address, dwSize, protectFlags, &oldProtectFlags);
            if (result == FALSE)
            {
                CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
            }
        }
    }
    else
#endif
    {
        address = VirtualAlloc(lpAddress, dwSize, allocationType, protectFlags);
        if (address == nullptr)
        {
            MemoryOperationLastError::RecordLastError();
            return nullptr;
        }
    }

    return address;
}